

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

void __thiscall OpenMD::Molecule::~Molecule(Molecule *this)

{
  pointer ppAVar1;
  pointer ppBVar2;
  pointer ppBVar3;
  pointer ppTVar4;
  pointer ppIVar5;
  pointer ppRVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  pointer ppCVar9;
  pointer ppSVar10;
  pointer ppHVar11;
  Atom **elem;
  pointer ppAVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  pointer ppRVar17;
  pointer ppCVar18;
  pointer ppCVar19;
  pointer ppCVar20;
  
  this->_vptr_Molecule = (_func_int **)&PTR__Molecule_00305868;
  ppAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar12 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppAVar12 != ppAVar1;
      ppAVar12 = ppAVar12 + 1) {
    if (*ppAVar12 != (Atom *)0x0) {
      (*((*ppAVar12)->super_StuntDouble)._vptr_StuntDouble[1])();
    }
  }
  ppBVar2 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar13 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppBVar13 != ppBVar2;
      ppBVar13 = ppBVar13 + 1) {
    if (*ppBVar13 != (Bond *)0x0) {
      (*((*ppBVar13)->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[1])();
    }
  }
  ppBVar3 = (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar14 = (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppBVar14 != ppBVar3;
      ppBVar14 = ppBVar14 + 1) {
    if (*ppBVar14 != (Bend *)0x0) {
      (*((*ppBVar14)->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[1])();
    }
  }
  ppTVar4 = (this->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar15 = (this->torsions_).
                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppTVar15 != ppTVar4; ppTVar15 = ppTVar15 + 1) {
    if (*ppTVar15 != (Torsion *)0x0) {
      (*((*ppTVar15)->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[1])();
    }
  }
  ppIVar5 = (this->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar16 = (this->inversions_).
                  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppIVar16 != ppIVar5;
      ppIVar16 = ppIVar16 + 1) {
    if (*ppIVar16 != (Inversion *)0x0) {
      (*((*ppIVar16)->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[1])();
    }
  }
  ppRVar6 = (this->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppRVar17 = (this->rigidBodies_).
                  super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppRVar17 != ppRVar6;
      ppRVar17 = ppRVar17 + 1) {
    if (*ppRVar17 != (RigidBody *)0x0) {
      (*((*ppRVar17)->super_StuntDouble)._vptr_StuntDouble[1])();
    }
  }
  ppCVar7 = (this->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar18 = (this->cutoffGroups_).
                  super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppCVar18 != ppCVar7;
      ppCVar18 = ppCVar18 + 1) {
    Utils::details::lifted_deleter<OpenMD::CutoffGroup*>(*ppCVar18);
  }
  ppCVar8 = (this->constraintPairs_).
            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar19 = (this->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar19 != ppCVar8;
      ppCVar19 = ppCVar19 + 1) {
    Utils::details::lifted_deleter<OpenMD::ConstraintPair*>(*ppCVar19);
  }
  ppCVar9 = (this->constraintElems_).
            super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar20 = (this->constraintElems_).
                  super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar20 != ppCVar9;
      ppCVar20 = ppCVar20 + 1) {
    Utils::details::lifted_deleter<OpenMD::ConstraintElem*>(*ppCVar20);
  }
  Utils::
  deletePointers<std::vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>>
            (&this->hBondDonors_);
  ppSVar10 = (this->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar10) {
    (this->integrableObjects_).
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar10;
  }
  ppAVar12 = (this->fluctuatingCharges_).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->fluctuatingCharges_).
      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar12) {
    (this->fluctuatingCharges_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar12;
  }
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_003022b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  ::~_Rb_tree(&(this->properties_).propMap_._M_t);
  ppAVar12 = (this->hBondAcceptors_).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppAVar12 != (pointer)0x0) {
    operator_delete(ppAVar12,(long)(this->hBondAcceptors_).
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppAVar12);
  }
  ppHVar11 = (this->hBondDonors_).
             super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppHVar11 != (pointer)0x0) {
    operator_delete(ppHVar11,(long)(this->hBondDonors_).
                                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppHVar11);
  }
  ppAVar12 = (this->fluctuatingCharges_).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppAVar12 != (pointer)0x0) {
    operator_delete(ppAVar12,(long)(this->fluctuatingCharges_).
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppAVar12);
  }
  ppCVar20 = (this->constraintElems_).
             super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar20 != (pointer)0x0) {
    operator_delete(ppCVar20,(long)(this->constraintElems_).
                                   super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppCVar20);
  }
  ppCVar19 = (this->constraintPairs_).
             super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar19 != (pointer)0x0) {
    operator_delete(ppCVar19,(long)(this->constraintPairs_).
                                   super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppCVar19);
  }
  ppCVar18 = (this->cutoffGroups_).
             super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar18 != (pointer)0x0) {
    operator_delete(ppCVar18,(long)(this->cutoffGroups_).
                                   super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppCVar18);
  }
  ppSVar10 = (this->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar10 != (pointer)0x0) {
    operator_delete(ppSVar10,(long)(this->integrableObjects_).
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppSVar10);
  }
  ppRVar17 = (this->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar17 != (pointer)0x0) {
    operator_delete(ppRVar17,(long)(this->rigidBodies_).
                                   super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppRVar17);
  }
  ppIVar16 = (this->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar16 != (pointer)0x0) {
    operator_delete(ppIVar16,(long)(this->inversions_).
                                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar16);
  }
  ppTVar15 = (this->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar15 != (pointer)0x0) {
    operator_delete(ppTVar15,(long)(this->torsions_).
                                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppTVar15);
  }
  ppBVar14 = (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar14 != (pointer)0x0) {
    operator_delete(ppBVar14,(long)(this->bends_).
                                   super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppBVar14);
  }
  ppBVar13 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar13 != (pointer)0x0) {
    operator_delete(ppBVar13,(long)(this->bonds_).
                                   super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppBVar13);
  }
  ppAVar12 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar12 != (pointer)0x0) {
    operator_delete(ppAVar12,(long)(this->atoms_).
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppAVar12);
    return;
  }
  return;
}

Assistant:

Molecule::~Molecule() {
    Utils::deletePointers(atoms_);
    Utils::deletePointers(bonds_);
    Utils::deletePointers(bends_);
    Utils::deletePointers(torsions_);
    Utils::deletePointers(inversions_);
    Utils::deletePointers(rigidBodies_);
    Utils::deletePointers(cutoffGroups_);
    Utils::deletePointers(constraintPairs_);
    Utils::deletePointers(constraintElems_);
    Utils::deletePointers(hBondDonors_);

    // integrableObjects_ don't own the objects
    integrableObjects_.clear();
    fluctuatingCharges_.clear();
  }